

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O1

bool __thiscall
MC::MC_Driver::addColunm(MC_Driver *this,string *colunmName,int attributype,int constraint)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TableInfo *pTVar3;
  iterator iVar4;
  pointer pcVar5;
  iterator iVar6;
  ostream *poVar7;
  long lVar8;
  char *pcVar9;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> p;
  uint local_80;
  int local_7c;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_50;
  
  local_80 = constraint;
  local_7c = attributype;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->tableInfo->getID)._M_t,colunmName);
  pTVar3 = this->tableInfo;
  if ((_Rb_tree_header *)iVar6._M_node == &(pTVar3->getID)._M_t._M_impl.super__Rb_tree_header) {
    if (pTVar3->attributeNum < 0x20) {
      if (((local_7c < 0x1d4c1) && (local_7c != 90000)) && (local_7c != 50000)) {
        pcVar9 = "attributetype of ";
        lVar8 = 0x11;
      }
      else {
        if (0x1d5bf < local_7c) {
          poVar7 = (ostream *)&std::cout;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"length of char type can not be longer than 255",0x2e);
          lVar8 = std::cout;
          goto LAB_00115639;
        }
        if (local_80 < 4) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pTVar3->attributeName,colunmName);
          pTVar3 = this->tableInfo;
          iVar4._M_current =
               (pTVar3->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (pTVar3->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&pTVar3->type,iVar4,&local_7c);
          }
          else {
            *iVar4._M_current = local_7c;
            (pTVar3->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          pTVar3 = this->tableInfo;
          iVar4._M_current =
               (pTVar3->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (pTVar3->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&pTVar3->constraint,iVar4,(int *)&local_80
                      );
          }
          else {
            *iVar4._M_current = local_80;
            (pTVar3->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          pTVar3 = this->tableInfo;
          paVar2 = &local_50.first.field_2;
          pcVar5 = (colunmName->_M_dataplus)._M_p;
          local_50.first._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar5,pcVar5 + colunmName->_M_string_length);
          local_50.second = pTVar3->attributeNum;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&this->tableInfo->getID,&local_50);
          if (local_80 == 3) {
            pTVar3 = this->tableInfo;
            pTVar3->primary_key_id = pTVar3->attributeNum;
            local_78._0_4_ = pTVar3->attributeNum;
            pcVar5 = (colunmName->_M_dataplus)._M_p;
            local_70._M_p = (pointer)&local_60;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar5,pcVar5 + colunmName->_M_string_length);
            std::
            _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<int,std::__cxx11::string>&>
                      ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                        *)&this->tableInfo->indexInfo,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_p != &local_60) {
              operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
            }
          }
          piVar1 = &this->tableInfo->attributeNum;
          *piVar1 = *piVar1 + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50.first._M_dataplus._M_p != paVar2) {
            operator_delete(local_50.first._M_dataplus._M_p,
                            local_50.first.field_2._M_allocated_capacity + 1);
          }
          return true;
        }
        pcVar9 = "attribute constraint of ";
        lVar8 = 0x18;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar8);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(colunmName->_M_dataplus)._M_p,
                          colunmName->_M_string_length);
      pcVar9 = " unrecognized\n";
      lVar8 = 0xe;
    }
    else {
      poVar7 = (ostream *)&std::cout;
      pcVar9 = "exceed maximum number of attribute\n";
      lVar8 = 0x23;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,lVar8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"duplicate colunm ",0x11);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(colunmName->_M_dataplus)._M_p,
                        colunmName->_M_string_length);
    lVar8 = *(long *)poVar7;
LAB_00115639:
    std::ios::widen((char)*(undefined8 *)(lVar8 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool MC::MC_Driver::addColunm(std::string colunmName,int attributype,int constraint){
    //是否重名
    auto it = tableInfo->getID.find(colunmName);
    if(it!=tableInfo->getID.end()){
        std::cout<<"duplicate colunm "<<colunmName<<std::endl;
        return false;
    }
    //是否超过最大属性数目
    if(tableInfo->attributeNum >= 32){
        std::cout<<"exceed maximum number of attribute\n";
        return false;
    }
    
    //检查类型是否没有错误
    if(attributype == 50000 || attributype == 90000 || attributype > 120000){
        if(attributype - 120000 > 255){
            //长度太长
            std::cout<<"length of char type can not be longer than 255"<<std::endl;
            return false;
        }
        //检查属性限制是否错误
        //0代表没有限制 1代表not null 2代表unique 3代表primary key
        if(constraint == 0 || constraint == 1 || constraint == 2 || constraint == 3){
            //类型和限制都没有错误
            tableInfo->attributeName.push_back(colunmName);
            tableInfo->type.push_back(attributype);
            tableInfo->constraint.push_back(constraint);
            std::pair<std::string,int> p = std::make_pair(colunmName,tableInfo->attributeNum);
            tableInfo->getID.insert(p);
            //如果是primary key需要加上它建立在的列的id
            if(constraint == 3){
                tableInfo->primary_key_id =  tableInfo->attributeNum;
                std::pair<int,std::string> p = std::make_pair(tableInfo->attributeNum, colunmName);
                tableInfo->indexInfo.insert(p);
            }
            tableInfo->attributeNum++;
            return true;
        }
        else{
            std::cout << "attribute constraint of " <<colunmName<<" unrecognized\n";
            return false;
        }
        //tableInfo->type_and_constraint.
    }else{
        //输入类型错误
        std::cout << "attributetype of " <<colunmName<<" unrecognized\n";
        return false;
    }
}